

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O0

void yactfr::internal::anon_unknown_23::validatePseudoUIntTypeRoles
               (PseudoDt *pseudoDt,UnsignedIntegerTypeRoleSet *allowedRoles)

{
  bool bVar1;
  reference ppPVar2;
  TextLocation *pTVar3;
  anon_class_8_1_0bdcc3f3 *in_RCX;
  _Node_iterator_base<const_yactfr::internal::PseudoDt_*,_false> local_b0;
  Index local_a8;
  Index IStack_a0;
  Index local_98;
  allocator local_79;
  string local_78;
  undefined1 local_58 [16];
  Set set;
  UnsignedIntegerTypeRoleSet *allowedRoles_local;
  PseudoDt *pseudoDt_local;
  
  if (pseudoDt != (PseudoDt *)0x0) {
    local_58._0_8_ = allowedRoles;
    set._M_h._M_single_bucket = (__node_base_ptr)allowedRoles;
    findPseudoUIntTypes<yactfr::internal::PseudoDt_const,yactfr::internal::(anonymous_namespace)::validatePseudoUIntTypeRoles(yactfr::internal::PseudoDt_const*,std::set<yactfr::UnsignedIntegerTypeRole,std::less<yactfr::UnsignedIntegerTypeRole>,std::allocator<yactfr::UnsignedIntegerTypeRole>>const&)::__0>
              ((Set *)(local_58 + 8),(internal *)pseudoDt,(PseudoDt *)local_58,in_RCX);
    bVar1 = std::
            unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
            ::empty((unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                     *)(local_58 + 8));
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_78,
                 "Unsigned integer type has at least one invalid role within its scope.",&local_79);
      local_b0._M_cur =
           (__node_type *)
           std::
           unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
           ::begin((unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                    *)(local_58 + 8));
      ppPVar2 = std::__detail::_Node_const_iterator<const_yactfr::internal::PseudoDt_*,_true,_false>
                ::operator*((_Node_const_iterator<const_yactfr::internal::PseudoDt_*,_true,_false> *
                            )&local_b0);
      pTVar3 = PseudoDt::loc(*ppPVar2);
      local_98 = pTVar3->_colNumber;
      local_a8 = pTVar3->_offset;
      IStack_a0 = pTVar3->_lineNumber;
      throwTextParseError(&local_78,*pTVar3);
    }
    std::
    unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
    ::~unordered_set((unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                      *)(local_58 + 8));
  }
  return;
}

Assistant:

void validatePseudoUIntTypeRoles(const PseudoDt * const pseudoDt,
                                 const UnsignedIntegerTypeRoleSet& allowedRoles)
{
    if (!pseudoDt) {
        return;
    }

    // find _invalid_ pseudo unsigned integer types
    const auto set = findPseudoUIntTypes(*pseudoDt, [&allowedRoles](auto& pseudoUIntType, auto) {
        // get roles
        auto& roles = call([&pseudoUIntType]() -> const UnsignedIntegerTypeRoleSet& {
            if (isFlUIntNotDtWrapper(pseudoUIntType)) {
                return static_cast<const PseudoFlUIntType&>(pseudoUIntType).roles();
            } else {
                assert(pseudoUIntType.kind() == PseudoDt::Kind::ScalarDtWrapper);

                auto& dt = static_cast<const PseudoScalarDtWrapper&>(pseudoUIntType).dt();

                if (dt.isFixedLengthUnsignedIntegerType()) {
                    return dt.asFixedLengthUnsignedIntegerType().roles();
                } else {
                    assert(dt.isVariableLengthUnsignedIntegerType());
                    return dt.asVariableLengthUnsignedIntegerType().roles();
                }
            }
        });

        for (auto& role : roles) {
            if (allowedRoles.count(role) == 0) {
                // invalid: `role` is not an element of `allowedRoles`
                return true;
            }
        }

        return false;
    });

    if (!set.empty()) {
        throwTextParseError("Unsigned integer type has at least one invalid role within its scope.",
                            (*set.begin())->loc());
    }
}